

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_min>(float v0,float *ptr,int size,int stride)

{
  int in_ESI;
  float in_XMM0_Da;
  int i;
  float sum;
  reduction_op_min op;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    in_XMM0_Da = reduction_op_min::operator()
                           ((reduction_op_min *)CONCAT44(in_stack_ffffffffffffffe4,in_XMM0_Da),
                            (float *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(float *)0xf3a179);
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size; i++)
    {
        sum = op(sum, *ptr);
        ptr += stride;
    }

    return sum;
}